

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_table.cc
# Opt level: O3

void __thiscall
transition_table_make_table_from_transition_args_Test::TestBody
          (transition_table_make_table_from_transition_args_Test *this)

{
  return;
}

Assistant:

TEST(transition_table, make_table_from_transition_args) {
    // clang-format off
    auto table = make_table_from_transition_args(
        state<s1>, event<e2>,                                   _,                         [] { return s2{}; }, state<s2>,
        state<s1>, event<e1>,                                   _,                                       [] {},         _,
        state<s1>, event<e2>,                                   _,                        [] { return s3{3}; }, state<s3>,
        state<s1>, event<e3>,                                   _, [](auto e) noexcept { return s3{e.value}; }, state<s3>,
        state<s3>, event<e3>,  [](auto e) { return e.value > 0; },                         [] { return s2{}; }, state<s2>,
        state<s3>, event<e3>, [](auto e) { return e.value == 0; },                        [] { return s3{0}; }, state<s3>);
    static_assert(decltype(table)::size == 4, "");
    // clang-format on

    namespace tr = ::state_machine::transition;
    using FirstKey = std::decay_t<decltype(std::get<0>(table.data()))>::key_type;
    static_assert(std::is_same<FirstKey, tr::Key<tr::State<s1>, tr::Event<e2>>>::value, "");
}